

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O1

ngx_int_t ngx_http_charset_body_filter(ngx_http_request_t *r,ngx_chain_t *in)

{
  byte bVar1;
  byte *pbVar2;
  ushort uVar3;
  ushort uVar4;
  uint32_t uVar5;
  long lVar6;
  u_char *puVar7;
  ngx_buf_t *pnVar8;
  ulong uVar9;
  ngx_chain_t *pnVar10;
  ngx_chain_t *pnVar11;
  ngx_chain_t **ppnVar12;
  ngx_int_t nVar13;
  u_char *puVar14;
  ushort uVar15;
  ushort uVar16;
  ngx_chain_t *pnVar17;
  u_char uVar18;
  ngx_pool_t *pnVar19;
  size_t sVar20;
  ulong uVar21;
  ngx_buf_t *pnVar22;
  ngx_chain_t **ppnVar23;
  byte *pbVar24;
  byte *pbVar25;
  byte *pbVar26;
  ngx_http_charset_ctx_t *pnVar27;
  bool bVar28;
  ngx_chain_t *local_88;
  ngx_chain_t *out;
  u_char *local_78;
  ngx_chain_t *local_70;
  ngx_chain_t *local_68;
  ngx_chain_t *local_60;
  ngx_chain_t *local_58;
  u_char *src;
  ngx_http_charset_ctx_t *local_48;
  ngx_chain_t *local_40;
  ngx_buf_t *local_38;
  
  pnVar27 = (ngx_http_charset_ctx_t *)r->ctx[ngx_http_charset_filter_module.ctx_index];
  if ((pnVar27 != (ngx_http_charset_ctx_t *)0x0) && (pnVar27->table != (u_char *)0x0)) {
    if (((pnVar27->field_0x46 & 3) != 0) || (pnVar27->busy != (ngx_chain_t *)0x0)) {
      local_88 = (ngx_chain_t *)0x0;
      if (in == (ngx_chain_t *)0x0) {
LAB_00161c87:
        pnVar10 = local_88;
        nVar13 = (*ngx_http_next_body_filter)(r,local_88);
        if (pnVar10 != (ngx_chain_t *)0x0) {
          pnVar11 = pnVar27->busy;
          if (pnVar27->busy == (ngx_chain_t *)0x0) {
            ppnVar12 = &pnVar27->busy;
          }
          else {
            do {
              pnVar17 = pnVar11;
              pnVar11 = pnVar17->next;
            } while (pnVar11 != (ngx_chain_t *)0x0);
            ppnVar12 = &pnVar17->next;
          }
          *ppnVar12 = pnVar10;
        }
        if (pnVar27->busy != (ngx_chain_t *)0x0) {
          pnVar10 = pnVar27->busy;
          do {
            pnVar8 = pnVar10->buf;
            if ((pnVar8->field_0x48 & 7) == 0) {
              lVar6 = pnVar8->file_last - pnVar8->file_pos;
            }
            else {
              lVar6 = (long)pnVar8->last - (long)pnVar8->pos;
            }
            if (lVar6 != 0) {
              return nVar13;
            }
            pnVar11 = pnVar10->next;
            pnVar27->busy = pnVar11;
            if ((ngx_module_t *)pnVar8->tag == &ngx_http_charset_filter_module) {
              pnVar22 = pnVar8->shadow;
              if (pnVar22 != (ngx_buf_t *)0x0) {
                pnVar22->pos = pnVar22->last;
              }
              ppnVar12 = &pnVar27->free_buffers;
              if (pnVar8->pos == (u_char *)0x0) {
                ppnVar12 = &pnVar27->free_bufs;
              }
              pnVar10->next = *ppnVar12;
              *ppnVar12 = pnVar10;
            }
            pnVar10 = pnVar11;
          } while (pnVar11 != (ngx_chain_t *)0x0);
        }
        return nVar13;
      }
      out = (ngx_chain_t *)&pnVar27->field_0x44;
      local_68 = (ngx_chain_t *)pnVar27->saved;
      ppnVar12 = &local_88;
      local_48 = pnVar27;
LAB_001613a9:
      local_38 = in->buf;
      if ((local_38->field_0x48 & 7) == 0) {
        lVar6 = local_38->file_last - local_38->file_pos;
      }
      else {
        lVar6 = (long)local_38->last - (long)local_38->pos;
      }
      if (lVar6 != 0) {
        if ((*(uint *)&out->buf >> 0x11 & 1) == 0) {
          src = (u_char *)r->pool;
          pnVar10 = (ngx_chain_t *)local_38->pos;
          local_58 = pnVar10;
          if (pnVar27->saved_len == 0) {
            pnVar11 = (ngx_chain_t *)local_38->last;
            if (pnVar10 < pnVar11) {
              lVar6 = 0;
              do {
                if ((char)*(u_char *)&local_58->buf < '\0') {
                  if ((ulong)-lVar6 < 0x201) {
                    uVar9 = (long)pnVar11 - (long)pnVar10;
                    local_60 = (ngx_chain_t *)0x0;
                    local_58 = pnVar10;
                  }
                  else {
                    pnVar10 = ngx_http_charset_get_buf((ngx_pool_t *)src,pnVar27);
                    if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_0016198d;
                    pnVar8 = pnVar10->buf;
                    uVar15 = *(ushort *)&local_38->field_0x48 & 1;
                    uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
                    *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffe | uVar15;
                    uVar4 = *(ushort *)&local_38->field_0x48 & 2;
                    *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffc | uVar15 | uVar4;
                    uVar16 = *(ushort *)&local_38->field_0x48 & 4;
                    *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfff8 | uVar15 | uVar4 | uVar16;
                    *(ushort *)&pnVar8->field_0x48 =
                         uVar3 & 0xffd8 | uVar15 | uVar4 | uVar16 |
                         *(ushort *)&local_38->field_0x48 & 0x20;
                    pnVar8->pos = local_38->pos;
                    pnVar8->last = (u_char *)local_58;
                    pnVar10->buf = pnVar8;
                    pnVar10->next = (ngx_chain_t *)0x0;
                    uVar9 = (long)local_38->last - (long)local_58;
                    local_70 = local_58;
                    local_60 = pnVar10;
                    uVar5 = ngx_utf8_decode((u_char **)&local_70,uVar9);
                    if (uVar5 == 0xfffffffe) {
                      memcpy(local_68,local_58,uVar9);
                      pnVar27->saved_len = uVar9;
                      pnVar8->shadow = local_38;
                      pnVar10 = local_60;
                      goto LAB_00161c57;
                    }
                  }
                  pnVar19 = (ngx_pool_t *)src;
                  sVar20 = uVar9 + 10;
                  if (9 < uVar9) {
                    sVar20 = uVar9;
                  }
                  local_40 = in;
                  pnVar10 = ngx_http_charset_get_buffer((ngx_pool_t *)src,pnVar27,sVar20);
                  if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161c51;
                  pnVar11 = pnVar10;
                  if (local_60 != (ngx_chain_t *)0x0) {
                    local_60->next = pnVar10;
                    pnVar11 = local_60;
                  }
                  pnVar8 = pnVar10->buf;
                  puVar7 = pnVar8->pos;
                  goto LAB_00161a3b;
                }
                local_58 = (ngx_chain_t *)((long)&local_58->buf + 1);
                lVar6 = lVar6 + -1;
              } while (local_58 != pnVar11);
            }
            pnVar10 = ngx_alloc_chain_link((ngx_pool_t *)src);
            if (pnVar10 == (ngx_chain_t *)0x0) {
LAB_0016198d:
              pnVar10 = (ngx_chain_t *)0x0;
            }
            else {
              pnVar10->buf = local_38;
              pnVar10->next = (ngx_chain_t *)0x0;
            }
          }
          else {
            if ((((ngx_pool_t *)src)->log->log_level & 0x100) != 0) {
              ngx_log_error_core(8,((ngx_pool_t *)src)->log,0,"http charset utf saved: %z");
            }
            uVar9 = pnVar27->saved_len;
            bVar28 = uVar9 < 4;
            if (bVar28) {
              puVar7 = (u_char *)((long)&local_58->buf + 1);
              pnVar27->saved[uVar9] = *(u_char *)&local_58->buf;
              if (puVar7 == local_38->last) {
                bVar28 = true;
              }
              else {
                do {
                  uVar21 = uVar9;
                  if (uVar21 == 3) {
                    uVar9 = 4;
                    break;
                  }
                  uVar18 = *puVar7;
                  puVar7 = puVar7 + 1;
                  pnVar27->saved[uVar21 + 1] = uVar18;
                  uVar9 = uVar21 + 1;
                } while (puVar7 != local_38->last);
                bVar28 = uVar21 < 3;
              }
            }
            local_70 = local_68;
            local_40 = in;
            uVar5 = ngx_utf8_decode((u_char **)&local_70,uVar9);
            if (uVar5 < 0x10000) {
              if (*(long *)(pnVar27->table + (ulong)(uVar5 >> 8) * 8) == 0) {
                uVar18 = '\0';
              }
              else {
                uVar18 = *(u_char *)
                          (*(long *)(pnVar27->table + (ulong)(uVar5 >> 8) * 8) +
                          (ulong)(uVar5 & 0xff));
              }
            }
            else {
              if (!(bool)(bVar28 ^ 1) && uVar5 == 0xfffffffe) {
                pnVar10 = ngx_http_charset_get_buf((ngx_pool_t *)src,pnVar27);
                if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161c51;
                pnVar8 = pnVar10->buf;
                pnVar8->pos = local_38->pos;
                pnVar8->last = local_38->last;
                pnVar8->field_0x48 = pnVar8->field_0x48 | 0x40;
                pnVar8->shadow = local_38;
                memcpy((u_char *)((long)&local_68->buf + pnVar27->saved_len),local_58,uVar9);
                pnVar27->saved_len = pnVar27->saved_len + uVar9;
                in = local_40;
                goto LAB_00161c57;
              }
              uVar18 = '\0';
            }
            uVar9 = (long)local_38->last - (long)local_38->pos;
            sVar20 = uVar9 + 10;
            if (9 < uVar9) {
              sVar20 = uVar9;
            }
            pnVar10 = ngx_http_charset_get_buffer((ngx_pool_t *)src,pnVar27,sVar20);
            pnVar19 = (ngx_pool_t *)src;
            if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161c51;
            pnVar8 = pnVar10->buf;
            puVar7 = pnVar8->pos;
            local_60 = pnVar10;
            if (uVar18 == '\0') {
              if (uVar5 == 0xfffffffe) {
                *puVar7 = '?';
                if (((*(ngx_log_t **)(src + 0x48))->log_level & 0x100) != 0) {
                  ngx_log_error_core(8,*(ngx_log_t **)(src + 0x48),0,"http charset invalid utf 0");
                  pnVar27 = local_48;
                }
                puVar7 = puVar7 + 1;
                local_70 = out;
              }
              else if (uVar5 < 0x110000) {
                puVar7 = ngx_sprintf(puVar7,"&#%uD;",(ulong)uVar5);
                pnVar27 = local_48;
              }
              else {
                *puVar7 = '?';
                puVar7 = puVar7 + 1;
                if (((*(ngx_log_t **)(src + 0x48))->log_level & 0x100) != 0) {
                  ngx_log_error_core(8,*(ngx_log_t **)(src + 0x48),0,"http charset invalid utf 1");
                  pnVar27 = local_48;
                }
              }
            }
            else {
              *puVar7 = uVar18;
              puVar7 = puVar7 + 1;
            }
            local_58 = (ngx_chain_t *)
                       ((long)local_58 +
                       ((long)local_70 - (long)((long)&local_68->buf + pnVar27->saved_len)));
            pnVar27->saved_len = 0;
            pnVar11 = local_60;
            pnVar10 = local_60;
LAB_00161a3b:
            local_60 = pnVar11;
            pnVar22 = local_38;
            if (local_58 < (ngx_chain_t *)local_38->last) {
              local_78 = pnVar27->table;
              ppnVar23 = &pnVar10->next;
              do {
                if ((ulong)((long)pnVar8->end - (long)puVar7) < 10) {
                  pnVar8->last = puVar7;
                  pnVar10 = ngx_http_charset_get_buffer
                                      (pnVar19,pnVar27,
                                       (size_t)(pnVar22->last + (10 - (long)local_58)));
                  if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161c51;
                  *ppnVar23 = pnVar10;
                  ppnVar23 = &pnVar10->next;
                  pnVar8 = pnVar10->buf;
                  puVar7 = pnVar8->pos;
                  pnVar22 = local_38;
                }
                pnVar10 = local_58;
                if ((char)*(u_char *)&local_58->buf < '\0') {
                  sVar20 = (long)pnVar22->last - (long)local_58;
                  uVar5 = ngx_utf8_decode((u_char **)&local_58,sVar20);
                  pnVar19 = (ngx_pool_t *)src;
                  pnVar22 = local_38;
                  pnVar27 = local_48;
                  if (uVar5 < 0x10000) {
                    if ((*(long *)(local_78 + (ulong)(uVar5 >> 8) * 8) == 0) ||
                       (uVar18 = *(u_char *)
                                  (*(long *)(local_78 + (ulong)(uVar5 >> 8) * 8) +
                                  (ulong)(uVar5 & 0xff)), uVar18 == '\0')) {
LAB_00161b3c:
                      puVar7 = ngx_sprintf(puVar7,"&#%uD;",(ulong)uVar5);
                      pnVar19 = (ngx_pool_t *)src;
                      pnVar22 = local_38;
                      pnVar27 = local_48;
                    }
                    else {
                      *puVar7 = uVar18;
                      puVar7 = puVar7 + 1;
                    }
                  }
                  else {
                    if (uVar5 == 0xfffffffe) {
                      memcpy(local_68,local_58,sVar20);
                      local_48->saved_len = sVar20;
                      pnVar22 = local_38;
                      pnVar27 = local_48;
                      if (pnVar8->pos == puVar7) {
                        *(ushort *)&pnVar8->field_0x48 =
                             (ushort)*(undefined4 *)&pnVar8->field_0x48 & 0xffbe | 0x40;
                      }
                      break;
                    }
                    if (uVar5 < 0x110000) goto LAB_00161b3c;
                    *puVar7 = '?';
                    puVar7 = puVar7 + 1;
                    if (((*(ngx_log_t **)(src + 0x48))->log_level & 0x100) != 0) {
                      ngx_log_error_core(8,*(ngx_log_t **)(src + 0x48),0,
                                         "http charset invalid utf 2");
                      pnVar22 = local_38;
                      pnVar27 = local_48;
                    }
                  }
                }
                else {
                  local_58 = (ngx_chain_t *)((long)&local_58->buf + 1);
                  *puVar7 = *(u_char *)&pnVar10->buf;
                  puVar7 = puVar7 + 1;
                }
              } while (local_58 < (ngx_chain_t *)pnVar22->last);
            }
            pnVar8->last = puVar7;
            uVar15 = *(ushort *)&pnVar22->field_0x48 & 0x80;
            uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
            *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xff7f | uVar15;
            uVar4 = *(ushort *)&pnVar22->field_0x48 & 0x100;
            *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfe7f | uVar15 | uVar4;
            *(ushort *)&pnVar8->field_0x48 =
                 uVar3 & 0xfe5f | uVar15 | uVar4 | *(ushort *)&pnVar22->field_0x48 & 0x20;
            pnVar8->shadow = pnVar22;
            pnVar10 = local_60;
            in = local_40;
          }
        }
        else {
          pnVar19 = r->pool;
          pbVar26 = local_38->pos;
          pbVar2 = local_38->last;
          if (pbVar26 < pbVar2) {
            puVar7 = pnVar27->table;
            uVar21 = (long)pbVar2 - (long)pbVar26;
            uVar9 = 0;
            pbVar24 = pbVar26;
            pbVar25 = pbVar26;
            do {
              if (puVar7[(ulong)*pbVar25 * 4] != '\x01') {
                src = (u_char *)pnVar19;
                if (uVar9 < 0x201) {
                  sVar20 = uVar9 + (uVar21 >> 1) * ((ulong)(ushort)*(uint *)&out->buf + 1);
                  local_60 = (ngx_chain_t *)0x0;
                  local_40 = in;
                }
                else {
                  local_40 = in;
                  pnVar10 = ngx_http_charset_get_buf(pnVar19,pnVar27);
                  if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_00161c51;
                  pnVar8 = pnVar10->buf;
                  uVar15 = *(ushort *)&local_38->field_0x48 & 1;
                  uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
                  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffe | uVar15;
                  uVar4 = *(ushort *)&local_38->field_0x48 & 2;
                  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfffc | uVar15 | uVar4;
                  uVar16 = *(ushort *)&local_38->field_0x48 & 4;
                  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfff8 | uVar15 | uVar4 | uVar16;
                  *(ushort *)&pnVar8->field_0x48 =
                       uVar3 & 0xffd8 | uVar15 | uVar4 | uVar16 |
                       *(ushort *)&local_38->field_0x48 & 0x20;
                  pnVar8->pos = local_38->pos;
                  pnVar8->last = pbVar25;
                  pnVar10->buf = pnVar8;
                  pnVar10->next = (ngx_chain_t *)0x0;
                  sVar20 = ((ulong)*(ushort *)&out->buf + 1) *
                           ((ulong)((long)local_38->last - (long)pbVar24) >> 1);
                  pbVar26 = pbVar25;
                  local_60 = pnVar10;
                }
                pnVar10 = ngx_http_charset_get_buffer((ngx_pool_t *)src,pnVar27,sVar20);
                in = local_40;
                if (pnVar10 == (ngx_chain_t *)0x0) goto LAB_0016198d;
                pnVar11 = pnVar10;
                if (local_60 != (ngx_chain_t *)0x0) {
                  local_60->next = pnVar10;
                  pnVar11 = local_60;
                }
                local_60 = pnVar11;
                pnVar8 = pnVar10->buf;
                puVar14 = pnVar8->pos;
                pnVar22 = local_38;
                if (local_38->last <= pbVar26) goto LAB_00161714;
                ppnVar23 = &pnVar10->next;
                local_78 = puVar7 + 1;
                pnVar19 = (ngx_pool_t *)src;
                goto LAB_0016167f;
              }
              pbVar25 = pbVar25 + 1;
              pbVar24 = pbVar24 + 1;
              uVar9 = uVar9 + 1;
              uVar21 = uVar21 - 1;
            } while (pbVar25 != pbVar2);
          }
          local_40 = in;
          pnVar10 = ngx_alloc_chain_link(pnVar19);
          if (pnVar10 == (ngx_chain_t *)0x0) {
LAB_00161c51:
            pnVar10 = (ngx_chain_t *)0x0;
            in = local_40;
          }
          else {
            pnVar10->buf = local_38;
            pnVar10->next = (ngx_chain_t *)0x0;
            in = local_40;
          }
        }
        goto LAB_00161c57;
      }
      pnVar10 = ngx_alloc_chain_link(r->pool);
      *ppnVar12 = pnVar10;
      if (pnVar10 == (ngx_chain_t *)0x0) {
        return -1;
      }
      pnVar10->buf = local_38;
      (*ppnVar12)->next = (ngx_chain_t *)0x0;
      ppnVar12 = &(*ppnVar12)->next;
      goto LAB_00161c77;
    }
    pnVar10 = in;
    if (in != (ngx_chain_t *)0x0) {
LAB_00161cd6:
      pnVar8 = pnVar10->buf;
      pbVar26 = pnVar8->pos;
      pbVar2 = pnVar8->last;
      if (pbVar26 < pbVar2) {
        puVar7 = pnVar27->table;
        do {
          if (*pbVar26 != puVar7[*pbVar26]) goto LAB_00161cfc;
          pbVar26 = pbVar26 + 1;
        } while (pbVar26 != pbVar2);
      }
      goto LAB_00161d18;
    }
  }
LAB_00161d21:
  nVar13 = (*ngx_http_next_body_filter)(r,in);
  return nVar13;
  while( true ) {
    if (uVar9 != 0) {
      uVar21 = 0;
      do {
        puVar14[uVar21] = local_78[uVar21 + (ulong)bVar1 * 4];
        uVar21 = uVar21 + 1;
      } while (uVar9 != uVar21);
      puVar14 = puVar14 + uVar21;
    }
    if (pnVar22->last <= pbVar26) break;
LAB_0016167f:
    bVar1 = *pbVar26;
    pbVar26 = pbVar26 + 1;
    uVar9 = (ulong)puVar7[(ulong)bVar1 * 4];
    if ((ulong)((long)pnVar8->end - (long)puVar14) < uVar9) {
      pnVar8->last = puVar14;
      uVar21 = (ulong)((long)pnVar22->last - (long)pbVar26) >> 1;
      pnVar10 = ngx_http_charset_get_buffer
                          (pnVar19,local_48,
                           *(ushort *)&local_48->field_0x44 * uVar21 + uVar21 + uVar9);
      if (pnVar10 == (ngx_chain_t *)0x0) {
        pnVar10 = (ngx_chain_t *)0x0;
        in = local_40;
        pnVar27 = local_48;
        goto LAB_00161c57;
      }
      *ppnVar23 = pnVar10;
      ppnVar23 = &pnVar10->next;
      pnVar8 = pnVar10->buf;
      puVar14 = pnVar8->pos;
      pnVar19 = (ngx_pool_t *)src;
      pnVar22 = local_38;
    }
  }
LAB_00161714:
  pnVar8->last = puVar14;
  uVar15 = *(ushort *)&pnVar22->field_0x48 & 0x80;
  uVar3 = (ushort)*(undefined4 *)&pnVar8->field_0x48;
  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xff7f | uVar15;
  uVar4 = *(ushort *)&pnVar22->field_0x48 & 0x100;
  *(ushort *)&pnVar8->field_0x48 = uVar3 & 0xfe7f | uVar15 | uVar4;
  *(ushort *)&pnVar8->field_0x48 =
       uVar3 & 0xfe5f | uVar15 | uVar4 | *(ushort *)&pnVar22->field_0x48 & 0x20;
  pnVar8->shadow = pnVar22;
  pnVar10 = local_60;
  in = local_40;
  pnVar27 = local_48;
LAB_00161c57:
  *ppnVar12 = pnVar10;
  ppnVar23 = ppnVar12;
  if (pnVar10 == (ngx_chain_t *)0x0) {
    return -1;
  }
  do {
    ppnVar12 = ppnVar23;
    ppnVar23 = &(*ppnVar12)->next;
  } while (*ppnVar12 != (ngx_chain_t *)0x0);
LAB_00161c77:
  in = in->next;
  if (in == (ngx_chain_t *)0x0) goto LAB_00161c87;
  goto LAB_001613a9;
LAB_00161cfc:
  do {
    bVar1 = puVar7[*pbVar26];
    if (*pbVar26 != bVar1) {
      *pbVar26 = bVar1;
    }
    pbVar26 = pbVar26 + 1;
  } while (pbVar26 < pbVar2);
  pnVar8->field_0x48 = pnVar8->field_0x48 & 0xef;
LAB_00161d18:
  ppnVar12 = &pnVar10->next;
  pnVar10 = *ppnVar12;
  if (*ppnVar12 == (ngx_chain_t *)0x0) goto LAB_00161d21;
  goto LAB_00161cd6;
}

Assistant:

static ngx_int_t
ngx_http_charset_body_filter(ngx_http_request_t *r, ngx_chain_t *in)
{
    ngx_int_t                rc;
    ngx_buf_t               *b;
    ngx_chain_t             *cl, *out, **ll;
    ngx_http_charset_ctx_t  *ctx;

    ctx = ngx_http_get_module_ctx(r, ngx_http_charset_filter_module);

    if (ctx == NULL || ctx->table == NULL) {
        return ngx_http_next_body_filter(r, in);
    }

    if ((ctx->to_utf8 || ctx->from_utf8) || ctx->busy) {

        out = NULL;
        ll = &out;

        for (cl = in; cl; cl = cl->next) {
            b = cl->buf;

            if (ngx_buf_size(b) == 0) {

                *ll = ngx_alloc_chain_link(r->pool);
                if (*ll == NULL) {
                    return NGX_ERROR;
                }

                (*ll)->buf = b;
                (*ll)->next = NULL;

                ll = &(*ll)->next;

                continue;
            }

            if (ctx->to_utf8) {
                *ll = ngx_http_charset_recode_to_utf8(r->pool, b, ctx);

            } else {
                *ll = ngx_http_charset_recode_from_utf8(r->pool, b, ctx);
            }

            if (*ll == NULL) {
                return NGX_ERROR;
            }

            while (*ll) {
                ll = &(*ll)->next;
            }
        }

        rc = ngx_http_next_body_filter(r, out);

        if (out) {
            if (ctx->busy == NULL) {
                ctx->busy = out;

            } else {
                for (cl = ctx->busy; cl->next; cl = cl->next) { /* void */ }
                cl->next = out;
            }
        }

        while (ctx->busy) {

            cl = ctx->busy;
            b = cl->buf;

            if (ngx_buf_size(b) != 0) {
                break;
            }

            ctx->busy = cl->next;

            if (b->tag != (ngx_buf_tag_t) &ngx_http_charset_filter_module) {
                continue;
            }

            if (b->shadow) {
                b->shadow->pos = b->shadow->last;
            }

            if (b->pos) {
                cl->next = ctx->free_buffers;
                ctx->free_buffers = cl;
                continue;
            }

            cl->next = ctx->free_bufs;
            ctx->free_bufs = cl;
        }

        return rc;
    }

    for (cl = in; cl; cl = cl->next) {
        (void) ngx_http_charset_recode(cl->buf, ctx->table);
    }

    return ngx_http_next_body_filter(r, in);
}